

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O0

char * XPMP2::XPMPValidateResourceFiles(char *resourceDir)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_RDI;
  string *in_stack_00000008;
  string *in_stack_ffffffffffffff78;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *local_70;
  allocator<char> local_51;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffcf;
  string *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  char *local_8;
  
  if ((in_RDI == (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                  *)0x0) || (sVar2 = strlen((char *)in_RDI), sVar2 < 5)) {
    if (glob < 4) {
      local_70 = in_RDI;
      if (in_RDI == (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                     *)0x0) {
        local_70 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    *)0x3cee7e;
      }
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
             ,0x40,"XPMPValidateResourceFiles",logERR,"Resource directory too short: %s",local_70);
    }
    local_8 = "resourceDir too short / nullptr";
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    TOPOSIX(in_stack_ffffffffffffff78);
    std::__cxx11::string::operator=((string *)&DAT_0047dc78,(string *)&stack0xffffffffffffffd0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    std::allocator<char>::~allocator(&local_51);
    pcVar3 = (char *)std::__cxx11::string::back();
    if (*pcVar3 == '/') {
      std::__cxx11::string::pop_back();
    }
    bVar1 = IsDir(in_stack_00000008);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)&DAT_0047dc78,'/');
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
      operator[](in_RDI,(size_type)in_stack_ffffffffffffff78);
      bVar1 = FindResFile(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                          (bool)in_stack_ffffffffffffffcf);
      if (bVar1) {
        std::
        array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
        ::operator[](in_RDI,(size_type)in_stack_ffffffffffffff78);
        bVar1 = FindResFile(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            (bool)in_stack_ffffffffffffffcf);
        if ((!bVar1) && (glob < 3)) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
                 ,0x54,"XPMPValidateResourceFiles",logWARN,
                 "Optional file relOp.txt not available in resource directory");
        }
        bVar1 = FindResFile(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            (bool)in_stack_ffffffffffffffcf);
        if (bVar1) {
          bVar1 = FindResFile(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                              (bool)in_stack_ffffffffffffffcf);
          if (bVar1) {
            bVar1 = FindResFile(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                (bool)in_stack_ffffffffffffffcf);
            if (((!bVar1) && ((DAT_0047da47 & 1) != 0)) && (glob < 3)) {
              uVar4 = std::__cxx11::string::c_str();
              LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
                     ,0x5e,"XPMPValidateResourceFiles",logWARN,
                     "File \'%s\' is missing in resource directory \'%s\'","Obj8DataRefs.txt",uVar4)
              ;
            }
            local_8 = "";
          }
          else {
            local_8 = "MapIcons.png not found in resource directory";
          }
        }
        else {
          local_8 = "Doc8643.txt not found in resource directory";
        }
      }
      else {
        local_8 = "related.txt not found in resource directory";
      }
    }
    else {
      if (glob < 4) {
        uVar4 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
               ,0x4a,"XPMPValidateResourceFiles",logERR,"Resource directory \'%s\' does not exist!",
               uVar4);
      }
      local_8 = "Resource directory unavailable";
    }
  }
  return local_8;
}

Assistant:

const char* XPMPValidateResourceFiles (const char* resourceDir)
{
    // Store the resource dir
    if (!resourceDir || strlen(resourceDir) < 5) {
        LOG_MSG(logERR, ERR_RSRC_DIR_INVALID, resourceDir ? resourceDir : "<nullptr>");
        return "resourceDir too short / nullptr";
    }
    glob.resourceDir = TOPOSIX(resourceDir);
    
    // for path validation it must not end in the path separator
    if (glob.resourceDir.back() == PATH_DELIM_STD)
        glob.resourceDir.pop_back();    
    // Check for its existence
    if (!IsDir(glob.resourceDir)) {
        LOG_MSG(logERR, ERR_RSRC_DIR_UNAVAIL, glob.resourceDir.c_str());
        return "Resource directory unavailable";
    }
    // now add a separator to the path for ease of future use
    glob.resourceDir += PATH_DELIM_STD;
    
    // Validate and save a few files
    if (!FindResFile(RSRC_RELATED, glob.pathRelated[REL_TXT_DESIGNATOR]))
        return "related.txt not found in resource directory";
    if (!FindResFile(RSRC_REL_OP, glob.pathRelated[REL_TXT_OP], false)) {
        LOG_MSG(logWARN, "Optional file relOp.txt not available in resource directory");
    }
    if (!FindResFile(RSRC_DOC8643, glob.pathDoc8643))
        return "Doc8643.txt not found in resource directory";
    if (!FindResFile(RSRC_MAP_ICONS, glob.pathMapIcons))
        return "MapIcons.png not found in resource directory";
    // this last one is not essentially required:
    if (!FindResFile(RSRC_OBJ8DATAREFS, glob.pathObj8DataRefs, false) &&
        glob.bObjReplDataRefs) {
        LOG_MSG(logWARN, ERR_RSRC_FILE_UNAVAIL,
                RSRC_OBJ8DATAREFS, glob.resourceDir.c_str());

    }
    
    // Success
    return "";
}